

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O1

void SHA256_Transform(SHA256_CTX *c,uchar *data)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  uVar2 = c->h[0];
  uVar3 = c->h[1];
  uVar4 = c->h[2];
  uVar5 = c->h[3];
  uVar6 = c->h[4];
  uVar7 = c->h[5];
  uVar8 = c->h[6];
  uVar9 = c->h[7];
  lVar18 = 0;
  uVar17 = uVar3;
  uVar15 = uVar4;
  uVar14 = uVar5;
  uVar22 = uVar6;
  uVar21 = uVar7;
  uVar23 = uVar8;
  uVar19 = uVar9;
  uVar11 = uVar2;
  do {
    uVar10 = uVar11;
    uVar20 = uVar23;
    uVar23 = uVar21;
    uVar21 = uVar22;
    uVar12 = uVar15;
    uVar15 = uVar17;
    uVar17 = *(uint *)(data + lVar18);
    uVar1 = swap_bytes(uVar17);
    *(undefined4 *)((long)c->data + lVar18) = uVar1;
    iVar13 = (~uVar21 & uVar20 | uVar23 & uVar21) + uVar19 +
             ((uVar21 >> 0x19 | uVar21 << 7) ^
             (uVar21 >> 0xb | uVar21 << 0x15) ^ (uVar21 >> 6 | uVar21 << 0x1a)) +
             (uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18) +
             *(int *)((long)K256 + lVar18);
    uVar22 = uVar14 + iVar13;
    uVar11 = (uVar15 & uVar12 ^ (uVar15 ^ uVar12) & uVar10) +
             ((uVar10 >> 0x16 | uVar10 << 10) ^
             (uVar10 >> 0xd | uVar10 << 0x13) ^ (uVar10 >> 2 | uVar10 << 0x1e)) + iVar13;
    lVar18 = lVar18 + 4;
    uVar17 = uVar10;
    uVar14 = uVar12;
    uVar19 = uVar20;
  } while (lVar18 != 0x40);
  lVar18 = 0x1e;
  do {
    uVar19 = uVar15;
    uVar15 = uVar10;
    uVar10 = uVar11;
    uVar16 = uVar23;
    uVar23 = uVar21;
    uVar21 = uVar22;
    uVar22 = (uint)lVar18;
    uVar17 = c->data[uVar22 - 0xd & 0xf];
    uVar14 = c->data[uVar22 & 0xf];
    iVar13 = *(int *)("llmsset_create: initial_size too small!\n" + lVar18 * 4 + 0x16);
    uVar11 = uVar22 - 0xe & 0xf;
    uVar17 = (uVar17 >> 3 ^ (uVar17 >> 0x12 | uVar17 << 0xe) ^ (uVar17 >> 7 | uVar17 << 0x19)) +
             c->data[uVar22 - 5 & 0xf] +
             (uVar14 >> 10 ^ (uVar14 >> 0x13 | uVar14 << 0xd) ^ (uVar14 >> 0x11 | uVar14 << 0xf)) +
             c->data[uVar11];
    c->data[uVar11] = uVar17;
    iVar13 = uVar17 + (~uVar21 & uVar16 | uVar23 & uVar21) + uVar20 +
                      ((uVar21 >> 0x19 | uVar21 << 7) ^
                      (uVar21 >> 0xb | uVar21 << 0x15) ^ (uVar21 >> 6 | uVar21 << 0x1a)) + iVar13;
    uVar22 = uVar12 + iVar13;
    uVar11 = (uVar15 & uVar19 ^ (uVar15 ^ uVar19) & uVar10) +
             ((uVar10 >> 0x16 | uVar10 << 10) ^
             (uVar10 >> 0xd | uVar10 << 0x13) ^ (uVar10 >> 2 | uVar10 << 0x1e)) + iVar13;
    lVar18 = lVar18 + 1;
    uVar20 = uVar16;
    uVar12 = uVar19;
  } while (lVar18 != 0x4e);
  c->h[0] = uVar11 + uVar2;
  c->h[1] = uVar10 + uVar3;
  c->h[2] = uVar15 + uVar4;
  c->h[3] = uVar19 + uVar5;
  c->h[4] = uVar22 + uVar6;
  c->h[5] = uVar21 + uVar7;
  c->h[6] = uVar23 + uVar8;
  c->h[7] = uVar16 + uVar9;
  return;
}

Assistant:

void SHA256_Transform(SHA256_CTX* context, const sha2_word32* data) {
	sha2_word32	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word32	T1, T2, *W256;
	int		j;

	W256 = (sha2_word32*)context->buffer;

	/* Initialize registers with the prev. intermediate value */
	a = context->state[0];
	b = context->state[1];
	c = context->state[2];
	d = context->state[3];
	e = context->state[4];
	f = context->state[5];
	g = context->state[6];
	h = context->state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Copy data while converting to host byte order */
		REVERSE32(*data++,W256[j]);
		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + W256[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-256 compression function to update a..h with copy */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + (W256[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W256[(j+1)&0x0f];
		s0 = sigma0_256(s0);
		s1 = W256[(j+14)&0x0f];	
		s1 = sigma1_256(s1);

		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + 
		     (W256[j&0x0f] += s1 + W256[(j+9)&0x0f] + s0);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 64);

	/* Compute the current intermediate hash value */
	context->state[0] += a;
	context->state[1] += b;
	context->state[2] += c;
	context->state[3] += d;
	context->state[4] += e;
	context->state[5] += f;
	context->state[6] += g;
	context->state[7] += h;
}